

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::CPPelse(TPpContext *this,int matchelse,TPpToken *ppToken)

{
  int iVar1;
  int local_30;
  int nextAtom;
  int token;
  int depth;
  TPpToken *ppToken_local;
  int matchelse_local;
  TPpContext *this_local;
  
  this->inElseSkip = true;
  nextAtom = 0;
  local_30 = scanToken(this,ppToken);
  while( true ) {
    while( true ) {
      while( true ) {
        do {
          while( true ) {
            if (local_30 == -1) goto LAB_006c7987;
            if (local_30 == 0x23) break;
            while (local_30 != 10 && local_30 != -1) {
              local_30 = scanToken(this,ppToken);
            }
            if (local_30 == -1) {
              return -1;
            }
            local_30 = scanToken(this,ppToken);
          }
          local_30 = scanToken(this,ppToken);
        } while (local_30 != 0xa2);
        iVar1 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
        if (((iVar1 != 0xa5) && (iVar1 != 0xa6)) && (iVar1 != 0xa7)) break;
        nextAtom = nextAtom + 1;
        if ((0x40 < this->ifdepth) || (0x40 < this->elsetracker)) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"maximum nesting depth exceeded",
                     "#if/#ifdef/#ifndef","");
          return -1;
        }
        this->ifdepth = this->ifdepth + 1;
        this->elsetracker = this->elsetracker + 1;
      }
      if (iVar1 == 0xaa) break;
      if ((matchelse == 0) || (nextAtom != 0)) {
        if (iVar1 == 0xa8) {
          if ((this->elseSeen[this->elsetracker] & 1U) == 0) {
            this->elseSeen[this->elsetracker] = true;
          }
          else {
            (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                      (this->parseContext,ppToken,"#else after #else","#else","");
          }
          iVar1 = scanToken(this,ppToken);
          local_30 = extraTokenCheck(this,0xa8,ppToken,iVar1);
        }
        else if ((iVar1 == 0xa9) && ((this->elseSeen[this->elsetracker] & 1U) != 0)) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"#elif after #else","#elif","");
        }
      }
      else {
        if (iVar1 == 0xa8) {
          this->elseSeen[this->elsetracker] = true;
          iVar1 = scanToken(this,ppToken);
          local_30 = extraTokenCheck(this,0xa8,ppToken,iVar1);
          goto LAB_006c7987;
        }
        if (iVar1 == 0xa9) {
          if ((this->elseSeen[this->elsetracker] & 1U) != 0) {
            (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                      (this->parseContext,ppToken,"#elif after #else","#elif","");
          }
          if (0 < this->ifdepth) {
            this->ifdepth = this->ifdepth + -1;
            this->elseSeen[this->elsetracker] = false;
            this->elsetracker = this->elsetracker + -1;
          }
          this->inElseSkip = false;
          iVar1 = CPPif(this,ppToken);
          return iVar1;
        }
      }
    }
    iVar1 = scanToken(this,ppToken);
    local_30 = extraTokenCheck(this,0xaa,ppToken,iVar1);
    this->elseSeen[this->elsetracker] = false;
    this->elsetracker = this->elsetracker + -1;
    if (nextAtom == 0) break;
    nextAtom = nextAtom + -1;
    this->ifdepth = this->ifdepth + -1;
  }
  if (0 < this->ifdepth) {
    this->ifdepth = this->ifdepth + -1;
  }
LAB_006c7987:
  this->inElseSkip = false;
  return local_30;
}

Assistant:

int TPpContext::CPPelse(int matchelse, TPpToken* ppToken)
{
    inElseSkip = true;
    int depth = 0;
    int token = scanToken(ppToken);

    while (token != EndOfInput) {
        if (token != '#') {
            while (token != '\n' && token != EndOfInput)
                token = scanToken(ppToken);

            if (token == EndOfInput)
                return token;

            token = scanToken(ppToken);
            continue;
        }

        if ((token = scanToken(ppToken)) != PpAtomIdentifier)
            continue;

        int nextAtom = atomStrings.getAtom(ppToken->name);
        if (nextAtom == PpAtomIf || nextAtom == PpAtomIfdef || nextAtom == PpAtomIfndef) {
            depth++;
            if (ifdepth >= maxIfNesting || elsetracker >= maxIfNesting) {
                parseContext.ppError(ppToken->loc, "maximum nesting depth exceeded", "#if/#ifdef/#ifndef", "");
                return EndOfInput;
            } else {
                ifdepth++;
                elsetracker++;
            }
        } else if (nextAtom == PpAtomEndif) {
            token = extraTokenCheck(nextAtom, ppToken, scanToken(ppToken));
            elseSeen[elsetracker] = false;
            --elsetracker;
            if (depth == 0) {
                // found the #endif we are looking for
                if (ifdepth > 0)
                    --ifdepth;
                break;
            }
            --depth;
            --ifdepth;
        } else if (matchelse && depth == 0) {
            if (nextAtom == PpAtomElse) {
                elseSeen[elsetracker] = true;
                token = extraTokenCheck(nextAtom, ppToken, scanToken(ppToken));
                // found the #else we are looking for
                break;
            } else if (nextAtom == PpAtomElif) {
                if (elseSeen[elsetracker])
                    parseContext.ppError(ppToken->loc, "#elif after #else", "#elif", "");
                /* we decrement ifdepth here, because CPPif will increment
                * it and we really want to leave it alone */
                if (ifdepth > 0) {
                    --ifdepth;
                    elseSeen[elsetracker] = false;
                    --elsetracker;
                }
                inElseSkip = false;
                return CPPif(ppToken);
            }
        } else if (nextAtom == PpAtomElse) {
            if (elseSeen[elsetracker])
                parseContext.ppError(ppToken->loc, "#else after #else", "#else", "");
            else
                elseSeen[elsetracker] = true;
            token = extraTokenCheck(nextAtom, ppToken, scanToken(ppToken));
        } else if (nextAtom == PpAtomElif) {
            if (elseSeen[elsetracker])
                parseContext.ppError(ppToken->loc, "#elif after #else", "#elif", "");
        }
    }
    
    inElseSkip = false;
    return token;
}